

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O0

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_order_cancel *m)

{
  bool bVar1;
  pointer ppVar2;
  uint64_t timestamp;
  order_book *ob_00;
  long in_RSI;
  nordic_itch_handler *in_RDI;
  uint64_t unaff_retaddr;
  uint64_t in_stack_00000008;
  order_book *in_stack_00000010;
  order_book *ob;
  uint64_t quantity;
  iterator it;
  uint64_t order_id;
  event *in_stack_ffffffffffffff48;
  order_book *this_00;
  event_callback *timestamp_00;
  string local_78 [64];
  order_book *local_38;
  uint64_t local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false> local_20;
  uint64_t local_18;
  long local_10;
  
  local_10 = in_RSI;
  local_18 = itch_uatoi((char *)(in_RSI + 1),9);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
       ::find((unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
               *)in_stack_ffffffffffffff48,(key_type *)0x14ae98);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
       ::end((unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
              *)in_stack_ffffffffffffff48);
  bVar1 = std::__detail::operator!=(&local_20,&local_28);
  if (bVar1) {
    local_30 = itch_uatoi((char *)(local_10 + 10),9);
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_helix::order_book_&>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_helix::order_book_&>,_false,_false>
                         *)0x14aeff);
    local_38 = ppVar2->second;
    order_book::cancel(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    this_00 = local_38;
    timestamp = nordic_itch_handler::timestamp(in_RDI);
    order_book::set_timestamp(this_00,timestamp);
    timestamp_00 = &in_RDI->_process_event;
    ob_00 = (order_book *)order_book::symbol_abi_cxx11_(local_38);
    nordic_itch_handler::timestamp(in_RDI);
    make_ob_event(local_78,(uint64_t)timestamp_00,ob_00,(event_mask)((ulong)this_00 >> 0x20));
    std::function<void_(const_helix::event_&)>::operator()
              ((function<void_(const_helix::event_&)> *)this_00,in_stack_ffffffffffffff48);
    event::~event((event *)0x14afb3);
  }
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_order_cancel* m)
{
    uint64_t order_id = itch_uatoi(m->OrderReferenceNumber, sizeof(m->OrderReferenceNumber));
    auto it = order_id_map.find(order_id);
    if (it != order_id_map.end()) {
        uint64_t quantity = itch_uatoi(m->CanceledQuantity, sizeof(m->CanceledQuantity));
        auto& ob = it->second;
        ob.cancel(order_id, quantity);
        ob.set_timestamp(timestamp());
        _process_event(make_ob_event(ob.symbol(), timestamp(), &ob));
    }
}